

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_ChaseSight(void)

{
  Task *in_RDI;
  string sStack_aa8;
  SatisfiablePredicateParams local_a88;
  Task local_a80;
  Task stop;
  Task bark;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_aa8,"chaseSight",(allocator<char> *)&bark);
  Task::Task(in_RDI,&sStack_aa8,Compound);
  std::__cxx11::string::~string((string *)&sStack_aa8);
  in_RDI->identifier = ChaseSight;
  bark.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT35(bark.preconditions.requiredFlags.
                         super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>.
                         _M_impl.super__Vector_impl_data._M_start._5_3_,0x100000003);
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (RequiredFlag *)&bark);
  bark.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400000000;
  bark.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x42700000;
  std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::
  emplace_back<AI::RequiredValue>(&(in_RDI->preconditions).requiredValues,(RequiredValue *)&bark);
  create_Bark(&bark,RegainedSightOfPlayer);
  create_MoveToPlayer();
  stop.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_a80.loop.super__Function_base._M_manager;
  stop.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_a80.loop.super__Function_base._M_functor._M_unused._0_8_;
  stop.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_a80.loop.super__Function_base._M_functor._8_8_;
  local_a80.loop.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a80.loop.super__Function_base._M_functor._8_8_ = 0;
  local_a80.loop.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:273:15)>
       ::_M_manager;
  stop.preconditions.requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a80.loop._M_invoker;
  local_a80.loop._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:273:15)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&stop);
  stop.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_a80.finally.super__Function_base._M_manager;
  stop.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_a80.finally.super__Function_base._M_functor._M_unused._0_8_;
  stop.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_a80.finally.super__Function_base._M_functor._8_8_;
  local_a80.finally.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_a80.finally.super__Function_base._M_functor._8_8_ = 0;
  local_a80.finally.super__Function_base._M_manager =
       std::
       _Function_handler<void_(AI::WorldState_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:286:18)>
       ::_M_manager;
  stop.preconditions.requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_a80.finally._M_invoker;
  local_a80.finally._M_invoker =
       std::
       _Function_handler<void_(AI::WorldState_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:286:18)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&stop);
  Task::Task(&stop);
  std::__cxx11::string::assign((char *)&stop.debugName);
  stop.action = StopMoving;
  Task::addSubtask(in_RDI,&bark);
  Task::addSubtask(in_RDI,&local_a80);
  Task::addSubtask(in_RDI,&stop);
  local_a88.identifier = NearPlayer;
  local_a88.index = -1;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(in_RDI->postconditions).satisfiedPredicates,&local_a88);
  Task::~Task(&stop);
  Task::~Task(&local_a80);
  Task::~Task(&bark);
  return in_RDI;
}

Assistant:

Task create_ChaseSight()
	{
		Task chaseSight {"chaseSight", TaskType::Compound};
		chaseSight.identifier = TaskIdentifier::ChaseSight;
		chaseSight.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});
		chaseSight.preconditions.requiredValues.push_back(
			{WorldStateIdentifier::Alertness, ConditionOp::GreaterThan, 60.f});

		auto bark = create_Bark(Bark::RegainedSightOfPlayer);
		auto move = create_MoveToPlayer();

		move.loop = [](WorldState& state, WorldQuerier const&, Task& task)
		{
			/*auto& target = state.current.vectors[WorldStateIdentifier::PlayerPosition];
			auto& start = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto xAxis = target - start;
			xAxis.normalize();
			
			state.animationDriver->isHeadTracking = true;
			state.animationDriver->headRotation = 				
				(FRotationMatrix::MakeFromXZ(xAxis, {0.f, 0.f, 1.f}).ToQuat() * FQuat(FRotator(90, 0, 0)) * FQuat(FRotator(0.f, 0.f, 90.f))).Rotator();
			*/
		};

		move.finally = [](WorldState& state)
		{
			//state.animationDriver->isHeadTracking = false;
		};

		Task stop;
		stop.debugName = "stop";
		stop.action = Action::StopMoving;

		chaseSight.addSubtask(bark);
		chaseSight.addSubtask(move);
		chaseSight.addSubtask(stop);

		chaseSight.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		return chaseSight;
	}